

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnBrIfExpr(BinaryReaderInterp *this,Index depth)

{
  Result RVar1;
  Offset fixup_offset;
  Enum EVar2;
  Index keep_count;
  Index drop_count;
  Index local_9c;
  Location local_98;
  Var local_70;
  
  local_98.field_1.field_0.line = 0;
  local_98.field_1._4_8_ = 0;
  local_98.filename.data_ = (char *)0x0;
  local_98.filename.size_._0_4_ = 0;
  local_98.filename.size_._4_4_ = 0;
  Var::Var(&local_70,depth,&local_98);
  RVar1 = SharedValidator::OnBrIf
                    (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                     &local_70);
  Var::~Var(&local_70);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    RVar1 = GetBrDropKeepCount(this,depth,(Index *)&local_98,&local_9c);
    if (RVar1.enum_ != Error) {
      Istream::Emit(this->istream_,InterpBrUnless);
      fixup_offset = Istream::EmitFixupU32(this->istream_);
      EmitBr(this,depth,(Index)local_98.filename.data_,local_9c);
      Istream::ResolveFixupU32(this->istream_,fixup_offset);
      EVar2 = Ok;
    }
  }
  return (Result)EVar2;
}

Assistant:

Result BinaryReaderInterp::OnBrIfExpr(Index depth) {
  Index drop_count, keep_count;
  CHECK_RESULT(validator_.OnBrIf(loc, Var(depth)));
  CHECK_RESULT(GetBrDropKeepCount(depth, &drop_count, &keep_count));
  // Flip the br_if so if <cond> is true it can drop values from the stack.
  istream_.Emit(Opcode::InterpBrUnless);
  auto fixup = istream_.EmitFixupU32();
  EmitBr(depth, drop_count, keep_count);
  istream_.ResolveFixupU32(fixup);
  return Result::Ok;
}